

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_some_gcd_and_equal_left_right(void)

{
  ushort *puVar1;
  wide_integer *pwVar2;
  wide_integer *pwVar3;
  short *psVar4;
  bool bVar5;
  long lVar6;
  uintwide_t<256U,_unsigned_short,_void,_false> *b;
  bool bVar7;
  uint i;
  int iVar8;
  int in_R8D;
  bool bVar9;
  uintwide_t<256U,_unsigned_short,_void,_false> right;
  uintwide_t<256U,_unsigned_short,_void,_false> v_right;
  uintwide_t<256U,_unsigned_short,_void,_false> left;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  u_left;
  uintwide_t<256U,_unsigned_short,_void,_false> local_d8;
  uintwide_t<256U,_unsigned_short,_void,_false> local_b8;
  wide_integer local_90 [8];
  value_type_conflict3 avStack_88 [4];
  value_type_conflict3 local_80 [4];
  value_type_conflict3 avStack_78 [4];
  wide_integer local_70 [32];
  uintwide_t<256U,_unsigned_short,_void,_false> local_50;
  
  iVar8 = 0;
  bVar7 = true;
LAB_001145b3:
  b = (uintwide_t<256U,_unsigned_short,_void,_false> *)0x4c;
  generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_90,(test_uintwide_t_edge *)0x1,
             false,0x4c,in_R8D);
  local_d8.values.super_array<unsigned_short,_16UL>.elems[8] = local_80[0];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[9] = local_80[1];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[10] = local_80[2];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = local_80[3];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = avStack_78[0];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = avStack_78[1];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = avStack_78[2];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = avStack_78[3];
  local_d8.values.super_array<unsigned_short,_16UL>.elems._0_8_ = local_90;
  local_d8.values.super_array<unsigned_short,_16UL>.elems[4] = avStack_88[0];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[5] = avStack_88[1];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[6] = avStack_88[2];
  local_d8.values.super_array<unsigned_short,_16UL>.elems[7] = avStack_88[3];
  lVar6 = 0x1e;
  do {
    if (lVar6 == -2) {
      math::wide_integer::gcd<256u,unsigned_short,void,false>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_70,local_90,&local_d8,b);
      lVar6 = 0x1e;
      goto LAB_0011460f;
    }
    pwVar2 = local_90 + lVar6;
    b = (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)*(ushort *)pwVar2;
    puVar1 = (ushort *)((long)local_d8.values.super_array<unsigned_short,_16UL>.elems + lVar6);
    lVar6 = lVar6 + -2;
  } while (*(ushort *)pwVar2 == *puVar1);
  bVar9 = false;
  goto LAB_0011462c;
  while (pwVar2 = local_70 + lVar6, pwVar3 = local_90 + lVar6, lVar6 = lVar6 + -2,
        *(short *)pwVar2 == *(short *)pwVar3) {
LAB_0011460f:
    bVar9 = lVar6 == -2;
    if (bVar9) break;
  }
LAB_0011462c:
  local_b8.values.super_array<unsigned_short,_16UL>.elems._0_4_ = 1;
  math::wide_integer::operator+
            ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
              *)local_70,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_90,(uint *)&local_b8
            );
  local_b8.values.super_array<unsigned_short,_16UL>.elems[8] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[8];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[9] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[9];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[10] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[10];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[0xb];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[0xc] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[0xc];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[0xd] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[0xd];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[0xe] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[0xe];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[0xf];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[0] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[0];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[1] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[1];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[2] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[2];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[3] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[3];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[4] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[4];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[5] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[5];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[6] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[6];
  local_b8.values.super_array<unsigned_short,_16UL>.elems[7] =
       local_d8.values.super_array<unsigned_short,_16UL>.elems[7];
  lVar6 = 0x1e;
  do {
    if (lVar6 == -2) {
      bVar5 = false;
      goto LAB_001146ae;
    }
    pwVar2 = local_70 + lVar6;
    puVar1 = (ushort *)((long)local_b8.values.super_array<unsigned_short,_16UL>.elems + lVar6);
    lVar6 = lVar6 + -2;
  } while (*(ushort *)pwVar2 == *puVar1);
  math::wide_integer::gcd<256u,unsigned_short,void,false>
            (&local_50,local_70,&local_b8,
             (uintwide_t<256U,_unsigned_short,_void,_false> *)(ulong)*(ushort *)pwVar2);
  lVar6 = 0x1e;
  do {
    bVar5 = lVar6 != -2;
    if (lVar6 == -2) break;
    psVar4 = (short *)((long)local_50.values.super_array<unsigned_short,_16UL>.elems + lVar6);
    pwVar2 = local_70 + lVar6;
    lVar6 = lVar6 + -2;
  } while (*psVar4 == *(short *)pwVar2);
LAB_001146ae:
  bVar7 = (bool)(bVar7 & bVar9 & bVar5);
  iVar8 = iVar8 + 1;
  if (iVar8 == 0x40) {
    return bVar7;
  }
  goto LAB_001145b3;
}

Assistant:

auto test_some_gcd_and_equal_left_right() -> bool
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(64));
           ++i)
  {
    auto result_gcd_is_ok = true;

    const auto left =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::dec,
        static_cast<int>(std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits10 - static_cast<int>(INT8_C(1)))
      );

    const auto right = left;

    {
      const auto result_gcd_left_equal_right_is_ok = ((left == right) && (gcd(left, right) == left));

      result_gcd_is_ok = (result_gcd_left_equal_right_is_ok && result_gcd_is_ok);
    }

    {
      const auto u_left  = left + static_cast<unsigned>(UINT8_C(1));
      const auto v_right = right;

      const auto result_gcd_left_unequal_right_is_ok = ((u_left != v_right) && (gcd(u_left, v_right) != u_left));

      result_gcd_is_ok = (result_gcd_left_unequal_right_is_ok && result_gcd_is_ok);
    }

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  const auto gcd64_equal_checker =
    [](const std::size_t first, const std::size_t last_inclusive, const std::uint64_t right) // NOLINT(bugprone-easily-swappable-parameters)
    {
      #if defined(WIDE_INTEGER_NAMESPACE)
      using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
      #else
      using ::math::wide_integer::gcd;
      #endif

      auto left = static_cast<std::uint64_t>(local_edge_cases::small_integers[first]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

      for(auto ig = static_cast<std::size_t>(first + static_cast<std::size_t>(UINT8_C(1))); ig <= last_inclusive; ++ig) // NOLINT(altera-id-dependent-backward-branch)
      {
        left *= static_cast<std::uint64_t>(local_edge_cases::small_integers[ig]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)
      }

      const auto result_gcd_left_equal_right_is_ok = ((left == right) && (gcd(left, right) == left));

      return result_gcd_left_equal_right_is_ok;
    };

  {
    // Consider small prime factors from { 3 ...  53 }.
    // Product[Prime[i], {i, 2, 16}] = 16294579238595022365
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(2)),
        static_cast<std::size_t>(UINT8_C(16)),
        static_cast<std::uint64_t>(UINT64_C(16294579238595022365))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 59 ... 101 }.
    // Product[Prime[i], {i, 17, 26}] = 7145393598349078859
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(17)),
        static_cast<std::size_t>(UINT8_C(26)),
        static_cast<std::uint64_t>(UINT64_C(7145393598349078859))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 103 ... 149 }.
    // Product[Prime[i], {i, 27, 35}] = 6408001374760705163
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(27)),
        static_cast<std::size_t>(UINT8_C(35)),
        static_cast<std::uint64_t>(UINT64_C(6408001374760705163))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 151 ... 191 }.
    // Product[Prime[i], {i, 36, 43}] = 690862709424854779
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(36)),
        static_cast<std::size_t>(UINT8_C(43)),
        static_cast<std::uint64_t>(UINT64_C(690862709424854779))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }
  {
    // Consider small prime factors from { 193 ... 227 }.
    // Product[Prime[i], {i, 44, 49}] = 80814592450549
    const auto result_gcd64_equal_checker_is_ok =
      gcd64_equal_checker
      (
        static_cast<std::size_t>(UINT8_C(44)),
        static_cast<std::size_t>(UINT8_C(49)),
        static_cast<std::uint64_t>(UINT64_C(80814592450549))
      );

    result_is_ok = (result_gcd64_equal_checker_is_ok && result_is_ok);
  }

  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    // GCD[6170895419598858564, 1073014744210933590]
    // 594
    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(6170895419598858564)),
                           static_cast<std::uint64_t>(UINT64_C(1073014744210933590)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(594)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    // GCD[20769612331917304, 11556552886528217295]
    // 6673

    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(20769612331917304)),
                           static_cast<std::uint64_t>(UINT64_C(11556552886528217295)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(6673)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    // GCD[3263830144632800334, 9189394046487653520]
    // 56598

    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(3263830144632800334)),
                           static_cast<std::uint64_t>(UINT64_C(9189394046487653520)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(56598)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    // GCD[7515843862511910988, 11558893357905095758]
    // 420278

    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto gcd64 = gcd(static_cast<std::uint64_t>(UINT64_C(7515843862511910988)),
                           static_cast<std::uint64_t>(UINT64_C(11558893357905095758)));

    const auto result_gcd64_is_ok = (gcd64 == static_cast<std::uint64_t>(UINT64_C(420278)));

    result_is_ok = (result_gcd64_is_ok && result_is_ok);
  }

  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto result_gcd_left_zero = gcd(static_cast<std::uint64_t>(UINT64_C(7515843862511910988)),
                                          static_cast<std::uint64_t>(UINT64_C(0)));

    const auto result_gcd_left_zero_is_ok = (result_gcd_left_zero == static_cast<std::uint64_t>(UINT64_C(7515843862511910988)));

    result_is_ok = (result_gcd_left_zero_is_ok && result_is_ok);
  }

  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using WIDE_INTEGER_NAMESPACE::math::wide_integer::gcd;
    #else
    using ::math::wide_integer::gcd;
    #endif

    const auto result_gcd_right_zero = gcd(static_cast<std::uint64_t>(UINT64_C(0)),
                                           static_cast<std::uint64_t>(UINT64_C(7515843862511910988)));

    const auto result_gcd_right_zero_is_ok = (result_gcd_right_zero == static_cast<std::uint64_t>(UINT64_C(7515843862511910988)));

    result_is_ok = (result_gcd_right_zero_is_ok && result_is_ok);
  }

  return result_is_ok;
}